

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.hpp
# Opt level: O2

void __thiscall
pstore::in_memory_mapper::in_memory_mapper
          (in_memory_mapper *this,in_memory *file,bool write_enabled,uint64_t offset,uint64_t length
          )

{
  _func_int **pp_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _func_int **local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pointer((in_memory_mapper *)&local_48,file,offset);
  _Var2._M_pi = _Stack_40._M_pi;
  pp_Var1 = local_48;
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)&PTR___cxa_pure_virtual_00146b40;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = (_func_int **)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pp_Var1;
  (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_memory_mapper_base).is_writable_ = write_enabled;
  (this->super_memory_mapper_base).offset_ = offset;
  (this->super_memory_mapper_base).size_ = length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)&PTR__in_memory_mapper_00146b78;
  return;
}

Assistant:

in_memory_mapper (file::in_memory & file, bool const write_enabled,
                          std::uint64_t const offset, std::uint64_t const length)
                : memory_mapper_base (pointer (file, offset), write_enabled, offset, length) {}